

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::testCompressedFormatsSupported
          (TestStatus *__return_storage_ptr__,Context *context)

{
  TestContext *this;
  MessageBuilder *pMVar1;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  allocator<char> local_801;
  string local_800;
  MessageBuilder local_7e0;
  MessageBuilder local_660;
  MessageBuilder local_4e0;
  MessageBuilder local_360;
  MessageBuilder local_1d0;
  undefined1 local_4a;
  byte local_49;
  bool allSupported;
  char *pcStack_48;
  bool featureBitSet;
  char *featureName;
  char *setName;
  int setNdx;
  int numWarnings;
  int numErrors;
  int numSupportedSets;
  VkPhysicalDeviceFeatures *features;
  TestLog *log;
  Context *context_local;
  
  log = (TestLog *)context;
  context_local = (Context *)__return_storage_ptr__;
  this = Context::getTestContext(context);
  features = (VkPhysicalDeviceFeatures *)tcu::TestContext::getLog(this);
  _numErrors = Context::getDeviceFeatures((Context *)log);
  numWarnings = 0;
  setNdx = 0;
  setName._4_4_ = 0;
  for (setName._0_4_ = 0; (int)setName < 3; setName._0_4_ = (int)setName + 1) {
    featureName = testCompressedFormatsSupported::s_compressedFormatSets[(int)setName].setName;
    pcStack_48 = testCompressedFormatsSupported::s_compressedFormatSets[(int)setName].featureName;
    local_49 = *(int *)((long)&_numErrors->robustBufferAccess +
                       testCompressedFormatsSupported::s_compressedFormatSets[(int)setName].feature)
               == 1;
    local_4a = optimalTilingFeaturesSupportedForAll
                         ((Context *)log,
                          testCompressedFormatsSupported::s_compressedFormatSets[(int)setName].
                          formatsBegin,
                          testCompressedFormatsSupported::s_compressedFormatSets[(int)setName].
                          formatsEnd,1);
    if (((local_49 & 1) == 0) || ((bool)local_4a)) {
      if (((bool)local_4a) && ((local_49 & 1) == 0)) {
        tcu::TestLog::operator<<
                  (&local_360,(TestLog *)features,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar1 = tcu::MessageBuilder::operator<<(&local_360,(char (*) [10])"WARNING: ");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&featureName);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [24])" formats supported but ");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&stack0xffffffffffffffb8);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])" = VK_FALSE");
        tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_360);
        setName._4_4_ = setName._4_4_ + 1;
      }
    }
    else {
      tcu::TestLog::operator<<
                (&local_1d0,(TestLog *)features,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [8])0x13857d6);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&stack0xffffffffffffffb8);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [16])" = VK_TRUE but ");
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&featureName);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [23])0x1343dda);
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1d0);
      setNdx = setNdx + 1;
    }
    if ((local_49 & 1) == 0) {
      tcu::TestLog::operator<<
                (&local_660,(TestLog *)features,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<(&local_660,&featureName);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [27])" formats are not supported");
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_660);
    }
    else {
      tcu::TestLog::operator<<
                (&local_4e0,(TestLog *)features,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<(&local_4e0,(char (*) [5])"All ");
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&featureName);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [23])" formats are supported");
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4e0);
      numWarnings = numWarnings + 1;
    }
  }
  if (numWarnings == 0) {
    tcu::TestLog::operator<<
              (&local_7e0,(TestLog *)features,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_7e0,(char (*) [36])"No compressed format sets supported");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7e0);
    setNdx = setNdx + 1;
  }
  if (setNdx < 1) {
    if (setName._4_4_ < 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_850,"Compressed texture format support is valid",&local_851);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_850);
      std::__cxx11::string::~string((string *)&local_850);
      std::allocator<char>::~allocator(&local_851);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_828,"Found inconsistencies in compressed format support",
                 &local_829);
      tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_828);
      std::__cxx11::string::~string((string *)&local_828);
      std::allocator<char>::~allocator(&local_829);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_800,"Compressed format support not valid",&local_801);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_800);
    std::__cxx11::string::~string((string *)&local_800);
    std::allocator<char>::~allocator(&local_801);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testCompressedFormatsSupported (Context& context)
{
	static const VkFormat s_allBcFormats[] =
	{
		VK_FORMAT_BC1_RGB_UNORM_BLOCK,
		VK_FORMAT_BC1_RGB_SRGB_BLOCK,
		VK_FORMAT_BC1_RGBA_UNORM_BLOCK,
		VK_FORMAT_BC1_RGBA_SRGB_BLOCK,
		VK_FORMAT_BC2_UNORM_BLOCK,
		VK_FORMAT_BC2_SRGB_BLOCK,
		VK_FORMAT_BC3_UNORM_BLOCK,
		VK_FORMAT_BC3_SRGB_BLOCK,
		VK_FORMAT_BC4_UNORM_BLOCK,
		VK_FORMAT_BC4_SNORM_BLOCK,
		VK_FORMAT_BC5_UNORM_BLOCK,
		VK_FORMAT_BC5_SNORM_BLOCK,
		VK_FORMAT_BC6H_UFLOAT_BLOCK,
		VK_FORMAT_BC6H_SFLOAT_BLOCK,
		VK_FORMAT_BC7_UNORM_BLOCK,
		VK_FORMAT_BC7_SRGB_BLOCK,
	};
	static const VkFormat s_allEtc2Formats[] =
	{
		VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK,
		VK_FORMAT_EAC_R11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11_SNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_SNORM_BLOCK,
	};
	static const VkFormat s_allAstcLdrFormats[] =
	{
		VK_FORMAT_ASTC_4x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_4x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_5x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_5x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x8_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x8_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x10_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x10_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x12_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x12_SRGB_BLOCK,
	};

	static const struct
	{
		const char*									setName;
		const char*									featureName;
		const VkBool32 VkPhysicalDeviceFeatures::*	feature;
		const VkFormat*								formatsBegin;
		const VkFormat*								formatsEnd;
	} s_compressedFormatSets[] =
	{
		{ "BC",			"textureCompressionBC",			&VkPhysicalDeviceFeatures::textureCompressionBC,		DE_ARRAY_BEGIN(s_allBcFormats),			DE_ARRAY_END(s_allBcFormats)		},
		{ "ETC2",		"textureCompressionETC2",		&VkPhysicalDeviceFeatures::textureCompressionETC2,		DE_ARRAY_BEGIN(s_allEtc2Formats),		DE_ARRAY_END(s_allEtc2Formats)		},
		{ "ASTC LDR",	"textureCompressionASTC_LDR",	&VkPhysicalDeviceFeatures::textureCompressionASTC_LDR,	DE_ARRAY_BEGIN(s_allAstcLdrFormats),	DE_ARRAY_END(s_allAstcLdrFormats)	},
	};

	TestLog&						log					= context.getTestContext().getLog();
	const VkPhysicalDeviceFeatures&	features			= context.getDeviceFeatures();
	int								numSupportedSets	= 0;
	int								numErrors			= 0;
	int								numWarnings			= 0;

	for (int setNdx = 0; setNdx < DE_LENGTH_OF_ARRAY(s_compressedFormatSets); ++setNdx)
	{
		const char* const	setName			= s_compressedFormatSets[setNdx].setName;
		const char* const	featureName		= s_compressedFormatSets[setNdx].featureName;
		const bool			featureBitSet	= features.*s_compressedFormatSets[setNdx].feature == VK_TRUE;
		const bool			allSupported	= optimalTilingFeaturesSupportedForAll(context,
																				   s_compressedFormatSets[setNdx].formatsBegin,
																				   s_compressedFormatSets[setNdx].formatsEnd,
																				   VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT);

		if (featureBitSet && !allSupported)
		{
			log << TestLog::Message << "ERROR: " << featureName << " = VK_TRUE but " << setName << " formats not supported" << TestLog::EndMessage;
			numErrors += 1;
		}
		else if (allSupported && !featureBitSet)
		{
			log << TestLog::Message << "WARNING: " << setName << " formats supported but " << featureName << " = VK_FALSE" << TestLog::EndMessage;
			numWarnings += 1;
		}

		if (featureBitSet)
		{
			log << TestLog::Message << "All " << setName << " formats are supported" << TestLog::EndMessage;
			numSupportedSets += 1;
		}
		else
			log << TestLog::Message << setName << " formats are not supported" << TestLog::EndMessage;
	}

	if (numSupportedSets == 0)
	{
		log << TestLog::Message << "No compressed format sets supported" << TestLog::EndMessage;
		numErrors += 1;
	}

	if (numErrors > 0)
		return tcu::TestStatus::fail("Compressed format support not valid");
	else if (numWarnings > 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Found inconsistencies in compressed format support");
	else
		return tcu::TestStatus::pass("Compressed texture format support is valid");
}